

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_GetAddressByLockingScript_Test::TestBody
          (AddressFactory_GetAddressByLockingScript_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address address;
  Script script;
  AddressFactory factory;
  Address *in_stack_ffffffffffffe9a8;
  undefined7 in_stack_ffffffffffffe9b0;
  undefined1 in_stack_ffffffffffffe9b7;
  AddressType *in_stack_ffffffffffffe9b8;
  undefined4 in_stack_ffffffffffffe9c0;
  undefined4 in_stack_ffffffffffffe9c4;
  char *in_stack_ffffffffffffe9c8;
  AssertHelper local_14d0;
  Message local_14c8;
  string local_14c0;
  AssertionResult local_14a0;
  AssertHelper local_1490;
  Message local_1488;
  undefined4 local_1480;
  AddressType local_147c;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffeb90;
  AssertHelper in_stack_ffffffffffffeb98;
  Message local_1460;
  ByteData local_1458;
  string local_1440;
  AssertionResult local_1420;
  AssertHelper local_1410;
  Message local_1408;
  Address local_1400;
  allocator local_1279;
  string local_1278;
  Script local_1258;
  AssertHelper local_1220;
  Message local_1218;
  string local_1210;
  AssertionResult local_11f0;
  AssertHelper local_11e0;
  Message local_11d8;
  undefined4 local_11d0;
  AddressType local_11cc;
  AssertionResult local_11c8;
  AssertHelper local_11b8;
  Message local_11b0;
  ByteData local_11a8;
  string local_1190;
  AssertionResult local_1170;
  AssertHelper local_1160;
  Message local_1158;
  Address local_1150;
  allocator local_fc9;
  string local_fc8;
  Script local_fa8;
  AssertHelper local_f70;
  Message local_f68;
  string local_f60;
  AssertionResult local_f40;
  AssertHelper local_f30;
  Message local_f28;
  undefined4 local_f20;
  AddressType local_f1c;
  AssertionResult local_f18;
  AssertHelper local_f08;
  Message local_f00;
  ByteData local_ef8;
  string local_ee0;
  AssertionResult local_ec0;
  AssertHelper local_eb0;
  Message local_ea8;
  Address local_ea0;
  allocator local_d19;
  string local_d18;
  Script local_cf8;
  AssertHelper local_cc0;
  Message local_cb8;
  string local_cb0;
  AssertionResult local_c90;
  AssertHelper local_c80;
  Message local_c78;
  undefined4 local_c70;
  AddressType local_c6c;
  AssertionResult local_c68;
  AssertHelper local_c58;
  Message local_c50;
  ByteData local_c48;
  string local_c30;
  AssertionResult local_c10;
  AssertHelper local_c00;
  Message local_bf8;
  Address local_bf0;
  allocator local_a69;
  string local_a68;
  Script local_a48;
  AssertHelper local_a10;
  Message local_a08;
  string local_a00;
  AssertionResult local_9e0;
  AssertHelper local_9d0;
  Message local_9c8;
  undefined4 local_9c0;
  AddressType local_9bc;
  AssertionResult local_9b8;
  AssertHelper local_9a8;
  Message local_9a0;
  ByteData local_998;
  string local_980;
  AssertionResult local_960;
  AssertHelper local_950;
  Message local_948;
  Address local_940;
  allocator local_7b9;
  string local_7b8;
  Script local_798;
  AssertHelper local_760;
  Message local_758;
  string local_750;
  AssertionResult local_730;
  AssertHelper local_720;
  Message local_718;
  undefined4 local_710;
  AddressType local_70c;
  AssertionResult local_708;
  AssertHelper local_6f8;
  Message local_6f0;
  ByteData local_6e8;
  string local_6d0;
  AssertionResult local_6b0;
  AssertHelper local_6a0;
  Message local_698;
  Address local_690;
  allocator local_509;
  string local_508;
  Script local_4e8;
  AssertHelper local_4b0;
  Message local_4a8;
  string local_4a0;
  AssertionResult local_480;
  AssertHelper local_470;
  Message local_468;
  undefined4 local_460;
  AddressType local_45c;
  AssertionResult local_458;
  AssertHelper local_448;
  Message local_440;
  ByteData local_438;
  string local_420;
  AssertionResult local_400;
  AssertHelper local_3f0;
  Message local_3e8 [2];
  Address local_3d8;
  allocator local_251;
  string local_250;
  Script local_230;
  Address local_1f8;
  Script local_68;
  
  cfd::AddressFactory::AddressFactory((AddressFactory *)0x1e323c);
  cfd::core::Script::Script(&local_68);
  cfd::core::Address::Address(&local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_250,
             "210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac",&local_251);
  cfd::core::Script::Script(&local_230,&local_250);
  cfd::core::Script::operator=(&local_68,&local_230);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript
                ((AddressFactory *)in_stack_ffffffffffffeb98.data_,
                 (Script *)in_stack_ffffffffffffeb90.ptr_);
      cfd::core::Address::operator=(&local_1f8,&local_3d8);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
    }
  }
  else {
    testing::Message::Message(local_3e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x219,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3f0,local_3e8);
    testing::internal::AssertHelper::~AssertHelper(&local_3f0);
    testing::Message::~Message((Message *)0x1e34e5);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9a8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_420,&local_438);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_400,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",pcVar3,
             "49a011f97ba520dab063f309bad59daeb30de101");
  std::__cxx11::string::~string((string *)&local_420);
  cfd::core::ByteData::~ByteData((ByteData *)0x1e35ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_400);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e3652);
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_448,&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    testing::Message::~Message((Message *)0x1e36b5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e370d);
  local_45c = cfd::core::Address::GetAddressType(&local_1f8);
  local_460 = 2;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffe9c8,
             (char *)CONCAT44(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0),
             in_stack_ffffffffffffe9b8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_458);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e37d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_470,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_470,&local_468);
    testing::internal::AssertHelper::~AssertHelper(&local_470);
    testing::Message::~Message((Message *)0x1e383b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e3893);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_4a0,&local_1f8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_480,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",pcVar3,"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  std::__cxx11::string::~string((string *)&local_4a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_480);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e3980);
    testing::internal::AssertHelper::AssertHelper
              (&local_4b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4b0);
    testing::Message::~Message((Message *)0x1e39e3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e3a3b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_508,"76a91449a011f97ba520dab063f309bad59daeb30de10188ac",&local_509);
  cfd::core::Script::Script(&local_4e8,&local_508);
  cfd::core::Script::operator=(&local_68,&local_4e8);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript
                ((AddressFactory *)in_stack_ffffffffffffeb98.data_,
                 (Script *)in_stack_ffffffffffffeb90.ptr_);
      cfd::core::Address::operator=(&local_1f8,&local_690);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
    }
  }
  else {
    testing::Message::Message(&local_698);
    testing::internal::AssertHelper::AssertHelper
              (&local_6a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21f,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_6a0,&local_698);
    testing::internal::AssertHelper::~AssertHelper(&local_6a0);
    testing::Message::~Message((Message *)0x1e3c8d);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9a8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_6d0,&local_6e8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_6b0,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",pcVar3,
             "49a011f97ba520dab063f309bad59daeb30de101");
  std::__cxx11::string::~string((string *)&local_6d0);
  cfd::core::ByteData::~ByteData((ByteData *)0x1e3d54);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6b0);
  if (!bVar1) {
    testing::Message::Message(&local_6f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e3dfa);
    testing::internal::AssertHelper::AssertHelper
              (&local_6f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x220,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6f8,&local_6f0);
    testing::internal::AssertHelper::~AssertHelper(&local_6f8);
    testing::Message::~Message((Message *)0x1e3e5d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e3eb5);
  local_70c = cfd::core::Address::GetAddressType(&local_1f8);
  local_710 = 2;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffe9c8,
             (char *)CONCAT44(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0),
             in_stack_ffffffffffffe9b8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_708);
  if (!bVar1) {
    testing::Message::Message(&local_718);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e3f80);
    testing::internal::AssertHelper::AssertHelper
              (&local_720,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x221,pcVar3);
    testing::internal::AssertHelper::operator=(&local_720,&local_718);
    testing::internal::AssertHelper::~AssertHelper(&local_720);
    testing::Message::~Message((Message *)0x1e3fe3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e403b);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_750,&local_1f8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_730,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",pcVar3,"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  std::__cxx11::string::~string((string *)&local_750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_730);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e4128);
    testing::internal::AssertHelper::AssertHelper
              (&local_760,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x222,pcVar3);
    testing::internal::AssertHelper::operator=(&local_760,&local_758);
    testing::internal::AssertHelper::~AssertHelper(&local_760);
    testing::Message::~Message((Message *)0x1e418b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e41e3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7b8,"a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487",&local_7b9);
  cfd::core::Script::Script(&local_798,&local_7b8);
  cfd::core::Script::operator=(&local_68,&local_798);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript
                ((AddressFactory *)in_stack_ffffffffffffeb98.data_,
                 (Script *)in_stack_ffffffffffffeb90.ptr_);
      cfd::core::Address::operator=(&local_1f8,&local_940);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
    }
  }
  else {
    testing::Message::Message(&local_948);
    testing::internal::AssertHelper::AssertHelper
              (&local_950,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x225,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_950,&local_948);
    testing::internal::AssertHelper::~AssertHelper(&local_950);
    testing::Message::~Message((Message *)0x1e4435);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9a8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_980,&local_998);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_960,"address.GetHash().GetHex().c_str()",
             "\"f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4\"",pcVar3,
             "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  std::__cxx11::string::~string((string *)&local_980);
  cfd::core::ByteData::~ByteData((ByteData *)0x1e44fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_960);
  if (!bVar1) {
    testing::Message::Message(&local_9a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e45a2);
    testing::internal::AssertHelper::AssertHelper
              (&local_9a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x226,pcVar3);
    testing::internal::AssertHelper::operator=(&local_9a8,&local_9a0);
    testing::internal::AssertHelper::~AssertHelper(&local_9a8);
    testing::Message::~Message((Message *)0x1e4605);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e465d);
  local_9bc = cfd::core::Address::GetAddressType(&local_1f8);
  local_9c0 = 1;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffe9c8,
             (char *)CONCAT44(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0),
             in_stack_ffffffffffffe9b8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9b8);
  if (!bVar1) {
    testing::Message::Message(&local_9c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e4728);
    testing::internal::AssertHelper::AssertHelper
              (&local_9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x227,pcVar3);
    testing::internal::AssertHelper::operator=(&local_9d0,&local_9c8);
    testing::internal::AssertHelper::~AssertHelper(&local_9d0);
    testing::Message::~Message((Message *)0x1e478b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e47e3);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_a00,&local_1f8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_9e0,"address.GetAddress().c_str()",
             "\"3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw\"",pcVar3,"3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");
  std::__cxx11::string::~string((string *)&local_a00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9e0);
  if (!bVar1) {
    testing::Message::Message(&local_a08);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e48d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_a10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x228,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a10,&local_a08);
    testing::internal::AssertHelper::~AssertHelper(&local_a10);
    testing::Message::~Message((Message *)0x1e4933);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e498b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a68,"0014925d4028880bd0c9d68fbc7fc7dfee976698629c",&local_a69);
  cfd::core::Script::Script(&local_a48,&local_a68);
  cfd::core::Script::operator=(&local_68,&local_a48);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
  std::__cxx11::string::~string((string *)&local_a68);
  std::allocator<char>::~allocator((allocator<char> *)&local_a69);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript
                ((AddressFactory *)in_stack_ffffffffffffeb98.data_,
                 (Script *)in_stack_ffffffffffffeb90.ptr_);
      cfd::core::Address::operator=(&local_1f8,&local_bf0);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
    }
  }
  else {
    testing::Message::Message(&local_bf8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22b,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_c00,&local_bf8);
    testing::internal::AssertHelper::~AssertHelper(&local_c00);
    testing::Message::~Message((Message *)0x1e4bdd);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9a8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_c30,&local_c48);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c10,"address.GetHash().GetHex().c_str()",
             "\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",pcVar3,
             "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  std::__cxx11::string::~string((string *)&local_c30);
  cfd::core::ByteData::~ByteData((ByteData *)0x1e4ca4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c10);
  if (!bVar1) {
    testing::Message::Message(&local_c50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e4d4a);
    testing::internal::AssertHelper::AssertHelper
              (&local_c58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c58,&local_c50);
    testing::internal::AssertHelper::~AssertHelper(&local_c58);
    testing::Message::~Message((Message *)0x1e4dad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e4e05);
  local_c6c = cfd::core::Address::GetAddressType(&local_1f8);
  local_c70 = 4;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffe9c8,
             (char *)CONCAT44(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0),
             in_stack_ffffffffffffe9b8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c68);
  if (!bVar1) {
    testing::Message::Message(&local_c78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e4ed0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c80,&local_c78);
    testing::internal::AssertHelper::~AssertHelper(&local_c80);
    testing::Message::~Message((Message *)0x1e4f33);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e4f8b);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_cb0,&local_1f8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c90,"address.GetAddress().c_str()",
             "\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\"",pcVar3,
             "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");
  std::__cxx11::string::~string((string *)&local_cb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c90);
  if (!bVar1) {
    testing::Message::Message(&local_cb8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e5078);
    testing::internal::AssertHelper::AssertHelper
              (&local_cc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_cc0,&local_cb8);
    testing::internal::AssertHelper::~AssertHelper(&local_cc0);
    testing::Message::~Message((Message *)0x1e50db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e5133);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d18,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437",&local_d19);
  cfd::core::Script::Script(&local_cf8,&local_d18);
  cfd::core::Script::operator=(&local_68,&local_cf8);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
  std::__cxx11::string::~string((string *)&local_d18);
  std::allocator<char>::~allocator((allocator<char> *)&local_d19);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript
                ((AddressFactory *)in_stack_ffffffffffffeb98.data_,
                 (Script *)in_stack_ffffffffffffeb90.ptr_);
      cfd::core::Address::operator=(&local_1f8,&local_ea0);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
    }
  }
  else {
    testing::Message::Message(&local_ea8);
    testing::internal::AssertHelper::AssertHelper
              (&local_eb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x231,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_eb0,&local_ea8);
    testing::internal::AssertHelper::~AssertHelper(&local_eb0);
    testing::Message::~Message((Message *)0x1e5385);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9a8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_ee0,&local_ef8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_ec0,"address.GetHash().GetHex().c_str()",
             "\"87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437\"",pcVar3,
             "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  std::__cxx11::string::~string((string *)&local_ee0);
  cfd::core::ByteData::~ByteData((ByteData *)0x1e544c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ec0);
  if (!bVar1) {
    testing::Message::Message(&local_f00);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e54f2);
    testing::internal::AssertHelper::AssertHelper
              (&local_f08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x232,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f08,&local_f00);
    testing::internal::AssertHelper::~AssertHelper(&local_f08);
    testing::Message::~Message((Message *)0x1e5555);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e55ad);
  local_f1c = cfd::core::Address::GetAddressType(&local_1f8);
  local_f20 = 3;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffe9c8,
             (char *)CONCAT44(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0),
             in_stack_ffffffffffffe9b8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f18);
  if (!bVar1) {
    testing::Message::Message(&local_f28);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e5678);
    testing::internal::AssertHelper::AssertHelper
              (&local_f30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x233,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f30,&local_f28);
    testing::internal::AssertHelper::~AssertHelper(&local_f30);
    testing::Message::~Message((Message *)0x1e56db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e5733);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_f60,&local_1f8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_f40,"address.GetAddress().c_str()",
             "\"bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a\"",pcVar3,
             "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  std::__cxx11::string::~string((string *)&local_f60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f40);
  if (!bVar1) {
    testing::Message::Message(&local_f68);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e581a);
    testing::internal::AssertHelper::AssertHelper
              (&local_f70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x234,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f70,&local_f68);
    testing::internal::AssertHelper::~AssertHelper(&local_f70);
    testing::Message::~Message((Message *)0x1e5877);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e58cf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_fc8,
             "51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",&local_fc9);
  cfd::core::Script::Script(&local_fa8,&local_fc8);
  cfd::core::Script::operator=(&local_68,&local_fa8);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
  std::__cxx11::string::~string((string *)&local_fc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fc9);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript
                ((AddressFactory *)in_stack_ffffffffffffeb98.data_,
                 (Script *)in_stack_ffffffffffffeb90.ptr_);
      cfd::core::Address::operator=(&local_1f8,&local_1150);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
    }
  }
  else {
    testing::Message::Message(&local_1158);
    testing::internal::AssertHelper::AssertHelper
              (&local_1160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x237,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1160,&local_1158);
    testing::internal::AssertHelper::~AssertHelper(&local_1160);
    testing::Message::~Message((Message *)0x1e5b0f);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9a8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1190,&local_11a8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1170,"address.GetHash().GetHex().c_str()",
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",pcVar3,
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  std::__cxx11::string::~string((string *)&local_1190);
  cfd::core::ByteData::~ByteData((ByteData *)0x1e5bd6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1170);
  if (!bVar1) {
    testing::Message::Message(&local_11b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e5c76);
    testing::internal::AssertHelper::AssertHelper
              (&local_11b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x238,pcVar3);
    testing::internal::AssertHelper::operator=(&local_11b8,&local_11b0);
    testing::internal::AssertHelper::~AssertHelper(&local_11b8);
    testing::Message::~Message((Message *)0x1e5cd3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e5d2b);
  local_11cc = cfd::core::Address::GetAddressType(&local_1f8);
  local_11d0 = 7;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffe9c8,
             (char *)CONCAT44(in_stack_ffffffffffffe9c4,in_stack_ffffffffffffe9c0),
             in_stack_ffffffffffffe9b8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_11c8);
  if (!bVar1) {
    testing::Message::Message(&local_11d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e5dea);
    testing::internal::AssertHelper::AssertHelper
              (&local_11e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x239,pcVar3);
    testing::internal::AssertHelper::operator=(&local_11e0,&local_11d8);
    testing::internal::AssertHelper::~AssertHelper(&local_11e0);
    testing::Message::~Message((Message *)0x1e5e47);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e5e9f);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_1210,&local_1f8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_11f0,"address.GetAddress().c_str()",
             "\"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4\"",pcVar3,
             "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  std::__cxx11::string::~string((string *)&local_1210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_11f0);
  if (!bVar1) {
    testing::Message::Message(&local_1218);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e5f86);
    testing::internal::AssertHelper::AssertHelper
              (&local_1220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1220,&local_1218);
    testing::internal::AssertHelper::~AssertHelper(&local_1220);
    testing::Message::~Message((Message *)0x1e5fe3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e603b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1278,
             "512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799",&local_1279);
  cfd::core::Script::Script(&local_1258,&local_1278);
  cfd::core::Script::operator=(&local_68,&local_1258);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
  std::__cxx11::string::~string((string *)&local_1278);
  std::allocator<char>::~allocator((allocator<char> *)&local_1279);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript
                ((AddressFactory *)in_stack_ffffffffffffeb98.data_,
                 (Script *)in_stack_ffffffffffffeb90.ptr_);
      cfd::core::Address::operator=(&local_1f8,&local_1400);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
    }
  }
  else {
    testing::Message::Message(&local_1408);
    testing::internal::AssertHelper::AssertHelper
              (&local_1410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23d,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1410,&local_1408);
    testing::internal::AssertHelper::~AssertHelper(&local_1410);
    testing::Message::~Message((Message *)0x1e627b);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9a8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1440,&local_1458);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1420,"address.GetHash().GetHex().c_str()",
             "\"88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799\"",pcVar3,
             "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  std::__cxx11::string::~string((string *)&local_1440);
  cfd::core::ByteData::~ByteData((ByteData *)0x1e6342);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1420);
  if (!bVar1) {
    testing::Message::Message(&local_1460);
    in_stack_ffffffffffffe9c8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1e63e2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffeb98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23e,in_stack_ffffffffffffe9c8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffeb98,&local_1460)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffeb98);
    testing::Message::~Message((Message *)0x1e643f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e6497);
  local_147c = cfd::core::Address::GetAddressType(&local_1f8);
  local_1480 = 7;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffe9c8,(char *)CONCAT44(local_147c,in_stack_ffffffffffffe9c0),
             in_stack_ffffffffffffe9b8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9b7,in_stack_ffffffffffffe9b0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffeb88);
  if (!bVar1) {
    testing::Message::Message(&local_1488);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e6556);
    testing::internal::AssertHelper::AssertHelper
              (&local_1490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1490,&local_1488);
    testing::internal::AssertHelper::~AssertHelper(&local_1490);
    testing::Message::~Message((Message *)0x1e65b3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e660b);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_14c0,&local_1f8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_14a0,"address.GetAddress().c_str()",
             "\"bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah\"",pcVar3,
             "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
  std::__cxx11::string::~string((string *)&local_14c0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_14a0);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_14c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e66f2);
    testing::internal::AssertHelper::AssertHelper
              (&local_14d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x240,pcVar3);
    testing::internal::AssertHelper::operator=(&local_14d0,&local_14c8);
    testing::internal::AssertHelper::~AssertHelper(&local_14d0);
    testing::Message::~Message((Message *)0x1e674d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e67a2);
  cfd::core::Address::~Address((Address *)CONCAT17(uVar2,in_stack_ffffffffffffe9b0));
  cfd::core::Script::~Script((Script *)CONCAT17(uVar2,in_stack_ffffffffffffe9b0));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1e67c9);
  return;
}

Assistant:

TEST(AddressFactory, GetAddressByLockingScript)
{
  AddressFactory factory;
  Script script;
  Address address;

  script = Script("210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("76a91449a011f97ba520dab063f309bad59daeb30de10188ac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2shAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");

  script = Script("0014925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wpkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");

  script = Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wshAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  
  script = Script("51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  
  script = Script("512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
}